

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O3

bool __thiscall
draco::KdTreeAttributesDecoder::DecodePortableAttributes
          (KdTreeAttributesDecoder *this,DecoderBuffer *in_buffer)

{
  long lVar1;
  DataType DVar2;
  Type attribute_type;
  pointer pIVar3;
  iterator __position;
  void *pvVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int32_t iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PointAttribute *pPVar12;
  _Head_base<4UL,_unsigned_int,_false> _Var13;
  uint total_dimensionality;
  ulong uVar14;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_a0;
  uint local_94;
  OutIt out_it;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  atts;
  
  if (in_buffer->bitstream_version_ < 0x203) {
    return true;
  }
  lVar1 = in_buffer->pos_ + 1;
  if (in_buffer->data_size_ < lVar1) {
    return false;
  }
  local_94 = (uint)(byte)in_buffer->data_[in_buffer->pos_];
  in_buffer->pos_ = lVar1;
  iVar7 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
            _vptr_AttributesDecoderInterface[7])();
  iVar7 = *(int *)(*(long *)(CONCAT44(extraout_var,iVar7) + 8) + 0xa0);
  iVar8 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
            _vptr_AttributesDecoderInterface[6])(this);
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::vector(&atts,(long)iVar8,(allocator_type *)&out_it);
  total_dimensionality = 0;
  for (uVar14 = 0;
      iVar8 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[6])(this), (long)uVar14 < (long)iVar8;
      uVar14 = uVar14 + 1) {
    iVar8 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
              _vptr_AttributesDecoderInterface[5])(this,uVar14 & 0xffffffff);
    iVar9 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
              _vptr_AttributesDecoderInterface[7])(this);
    pPVar12 = *(PointAttribute **)
               (*(long *)(*(long *)(CONCAT44(extraout_var_00,iVar9) + 8) + 0x10) + (long)iVar8 * 8);
    PointAttribute::Reset(pPVar12,(long)iVar7);
    pPVar12->identity_mapping_ = true;
    pIVar3 = (pPVar12->indices_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pPVar12->indices_map_).vector_.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar3) {
      (pPVar12->indices_map_).vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar3;
    }
    DVar2 = (pPVar12->super_GeometryAttribute).data_type_;
    if (DT_FLOAT32 < DVar2) {
LAB_001537f7:
      bVar6 = false;
      goto LAB_001538d9;
    }
    if ((0x2aU >> (DVar2 & 0x1f) & 1) == 0) {
      if ((0x54U >> (DVar2 & 0x1f) & 1) == 0) {
        if (DVar2 != DT_FLOAT32) goto LAB_001537f7;
        bVar5 = (pPVar12->super_GeometryAttribute).num_components_;
        GeometryAttribute::GeometryAttribute((GeometryAttribute *)&out_it);
        attribute_type = (pPVar12->super_GeometryAttribute).attribute_type_;
        iVar10 = DataTypeLength(DT_UINT32);
        GeometryAttribute::Init
                  ((GeometryAttribute *)&out_it,attribute_type,(DataBuffer *)0x0,bVar5,DT_UINT32,
                   false,(long)iVar10 * (ulong)bVar5,0);
        pPVar12 = (PointAttribute *)operator_new(0x70);
        PointAttribute::PointAttribute(pPVar12,(GeometryAttribute *)&out_it);
        pPVar12->identity_mapping_ = true;
        pIVar3 = (pPVar12->indices_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pPVar12->indices_map_).vector_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != pIVar3) {
          (pPVar12->indices_map_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar3;
        }
        local_a0._M_head_impl = pPVar12;
        PointAttribute::Reset(pPVar12,(long)iVar7);
        std::
        vector<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>,std::allocator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>>
        ::
        emplace_back<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>
                  ((vector<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>,std::allocator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>>
                    *)&this->quantized_portable_attributes_,
                   (unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *
                   )&local_a0);
        pPVar12 = (this->quantized_portable_attributes_).
                  super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
        if (local_a0._M_head_impl != (PointAttribute *)0x0) {
          std::default_delete<draco::PointAttribute>::operator()
                    ((default_delete<draco::PointAttribute> *)&local_a0,local_a0._M_head_impl);
        }
      }
    }
    else {
      bVar5 = (pPVar12->super_GeometryAttribute).num_components_;
      if (bVar5 != 0) {
        uVar11 = 0;
        do {
          out_it.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0;
          __position._M_current =
               (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&this->min_signed_values_,__position,(int *)&out_it);
            bVar5 = (pPVar12->super_GeometryAttribute).num_components_;
          }
          else {
            *__position._M_current = 0;
            (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < bVar5);
      }
    }
    DVar2 = (pPVar12->super_GeometryAttribute).data_type_;
    uVar11 = DataTypeLength(DVar2);
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    bVar5 = (pPVar12->super_GeometryAttribute).num_components_;
    atts.
    super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar14].
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
    .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl = pPVar12;
    atts.
    super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar14].
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
    .super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
    super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = total_dimensionality;
    atts.
    super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar14].
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
    .super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
    super__Head_base<2UL,_draco::DataType,_false>._M_head_impl = DVar2;
    atts.
    super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar14].
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
    .super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<3UL,_unsigned_int,_unsigned_int>.super__Head_base<3UL,_unsigned_int,_false>.
    _M_head_impl = uVar11;
    _Var13._M_head_impl._1_3_ = 0;
    _Var13._M_head_impl._0_1_ = bVar5;
    atts.
    super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar14].
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
    .super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<3UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<4UL,_unsigned_int>.
    super__Head_base<4UL,_unsigned_int,_false>._M_head_impl = _Var13._M_head_impl;
    total_dimensionality = total_dimensionality + _Var13._M_head_impl;
  }
  PointAttributeVectorOutputIterator<unsigned_int>::PointAttributeVectorOutputIterator
            (&out_it,&atts);
  switch(local_94) {
  case 0:
    bVar6 = DecodePoints<0,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,total_dimensionality,iVar7,in_buffer,&out_it);
    break;
  case 1:
    bVar6 = DecodePoints<1,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,total_dimensionality,iVar7,in_buffer,&out_it);
    break;
  case 2:
    bVar6 = DecodePoints<2,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,total_dimensionality,iVar7,in_buffer,&out_it);
    break;
  case 3:
    bVar6 = DecodePoints<3,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,total_dimensionality,iVar7,in_buffer,&out_it);
    break;
  case 4:
    bVar6 = DecodePoints<4,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,total_dimensionality,iVar7,in_buffer,&out_it);
    break;
  case 5:
    bVar6 = DecodePoints<5,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,total_dimensionality,iVar7,in_buffer,&out_it);
    break;
  case 6:
    bVar6 = DecodePoints<6,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,total_dimensionality,iVar7,in_buffer,&out_it);
    break;
  default:
    goto switchD_001537d7_default;
  }
  if (bVar6 == false) {
switchD_001537d7_default:
    bVar6 = false;
  }
  else {
    bVar6 = true;
  }
  if (out_it.attributes_.
      super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(out_it.attributes_.
                    super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)out_it.attributes_.
                          super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)out_it.attributes_.
                          super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar4 = (void *)CONCAT44(out_it.memory_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            out_it.memory_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)out_it.memory_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
LAB_001538d9:
  if (atts.
      super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(atts.
                    super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)atts.
                          super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)atts.
                          super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool KdTreeAttributesDecoder::DecodePortableAttributes(
    DecoderBuffer *in_buffer) {
  if (in_buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 3)) {
    // Old bitstream does everything in the
    // DecodeDataNeededByPortableTransforms() method.
    return true;
  }
  uint8_t compression_level = 0;
  if (!in_buffer->Decode(&compression_level)) {
    return false;
  }
  const int32_t num_points = GetDecoder()->point_cloud()->num_points();

  // Decode data using the kd tree decoding into integer (portable) attributes.
  // We first need to go over all attributes and create a new portable storage
  // for those attributes that need it (floating point attributes that have to
  // be dequantized after decoding).

  const int num_attributes = GetNumAttributes();
  uint32_t total_dimensionality = 0;  // position is a required dimension
  std::vector<AttributeTuple> atts(num_attributes);

  for (int i = 0; i < GetNumAttributes(); ++i) {
    const int att_id = GetAttributeId(i);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    // All attributes have the same number of values and identity mapping
    // between PointIndex and AttributeValueIndex.
    att->Reset(num_points);
    att->SetIdentityMapping();

    PointAttribute *target_att = nullptr;
    if (att->data_type() == DT_UINT32 || att->data_type() == DT_UINT16 ||
        att->data_type() == DT_UINT8) {
      // We can decode to these attributes directly.
      target_att = att;
    } else if (att->data_type() == DT_INT32 || att->data_type() == DT_INT16 ||
               att->data_type() == DT_INT8) {
      // Prepare storage for data that is used to convert unsigned values back
      // to the signed ones.
      for (int c = 0; c < att->num_components(); ++c) {
        min_signed_values_.push_back(0);
      }
      target_att = att;
    } else if (att->data_type() == DT_FLOAT32) {
      // Create a portable attribute that will hold the decoded data. We will
      // dequantize the decoded data to the final attribute later on.
      const int num_components = att->num_components();
      GeometryAttribute va;
      va.Init(att->attribute_type(), nullptr, num_components, DT_UINT32, false,
              num_components * DataTypeLength(DT_UINT32), 0);
      std::unique_ptr<PointAttribute> port_att(new PointAttribute(va));
      port_att->SetIdentityMapping();
      port_att->Reset(num_points);
      quantized_portable_attributes_.push_back(std::move(port_att));
      target_att = quantized_portable_attributes_.back().get();
    } else {
      // Unsupported type.
      return false;
    }
    // Add attribute to the output iterator used by the core algorithm.
    const DataType data_type = target_att->data_type();
    const uint32_t data_size = (std::max)(0, DataTypeLength(data_type));
    const uint32_t num_components = target_att->num_components();
    atts[i] = std::make_tuple(target_att, total_dimensionality, data_type,
                              data_size, num_components);
    total_dimensionality += num_components;
  }
  typedef PointAttributeVectorOutputIterator<uint32_t> OutIt;
  OutIt out_it(atts);

  switch (compression_level) {
    case 0: {
      if (!DecodePoints<0, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 1: {
      if (!DecodePoints<1, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 2: {
      if (!DecodePoints<2, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 3: {
      if (!DecodePoints<3, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 4: {
      if (!DecodePoints<4, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 5: {
      if (!DecodePoints<5, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 6: {
      if (!DecodePoints<6, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    default:
      return false;
  }
  return true;
}